

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Security.cpp
# Opt level: O0

bool Security::DontEncode(Opnd *opnd)

{
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  int32 iVar4;
  IntConstOpnd *pIVar5;
  AddrOpnd *this;
  IndirOpnd *this_00;
  ListOpnd *pLVar6;
  undefined4 *puVar7;
  bool local_42;
  byte local_41;
  IndirOpnd *indirOpnd;
  AddrOpnd *addrOpnd;
  IntConstOpnd *intConstOpnd;
  Opnd *opnd_local;
  
  OVar2 = IR::Opnd::GetKind(opnd);
  switch(OVar2) {
  case OpndKindIntConst:
    pIVar5 = IR::Opnd::AsIntConstOpnd(opnd);
    opnd_local._7_1_ = (bool)(pIVar5->m_dontEncode & 1);
    break;
  case OpndKindInt64Const:
    opnd_local._7_1_ = false;
    break;
  default:
    opnd_local._7_1_ = true;
    break;
  case OpndKindAddr:
    this = IR::Opnd::AsAddrOpnd(opnd);
    local_41 = 1;
    if ((this->field_0x28 & 1) == 0) {
      bVar3 = IR::AddrOpnd::IsVar(this);
      local_41 = 1;
      if ((bVar3) && (local_41 = 1, this->m_address != (Var)0x0)) {
        bVar3 = Js::TaggedNumber::Is(this->m_address);
        local_41 = bVar3 ^ 0xff;
      }
    }
    opnd_local._7_1_ = (bool)(local_41 & 1);
    break;
  case OpndKindIndir:
    this_00 = IR::Opnd::AsIndirOpnd(opnd);
    local_42 = true;
    if (((this_00->super_Opnd).field_0xe & 1) == 0) {
      iVar4 = IR::IndirOpnd::GetOffset(this_00);
      local_42 = iVar4 == 0;
    }
    opnd_local._7_1_ = local_42;
    break;
  case OpndKindList:
    pLVar6 = IR::Opnd::AsListOpnd(opnd);
    bVar3 = IR::ListOpnd::All<Security::DontEncode(IR::Opnd*)::__0>(pLVar6);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Security.cpp"
                         ,0x136,
                         "(opnd->AsListOpnd()->All([](IR::ListOpndType* opnd) { return DontEncode(opnd); }))"
                         ,
                         "opnd->AsListOpnd()->All([](IR::ListOpndType* opnd) { return DontEncode(opnd); })"
                        );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    opnd_local._7_1_ = true;
  }
  return opnd_local._7_1_;
}

Assistant:

bool
Security::DontEncode(IR::Opnd *opnd)
{
    switch (opnd->GetKind())
    {
    case IR::OpndKindIntConst:
    {
        IR::IntConstOpnd *intConstOpnd = opnd->AsIntConstOpnd();
        return intConstOpnd->m_dontEncode;
    }

    case IR::OpndKindAddr:
    {
        IR::AddrOpnd *addrOpnd = opnd->AsAddrOpnd();
        return (addrOpnd->m_dontEncode ||
            !addrOpnd->IsVar() ||
            addrOpnd->m_address == nullptr ||
            !Js::TaggedNumber::Is(addrOpnd->m_address));
    }
    case IR::OpndKindIndir:
    {
        IR::IndirOpnd *indirOpnd = opnd->AsIndirOpnd();
        return indirOpnd->m_dontEncode || indirOpnd->GetOffset() == 0;
    }
    case IR::OpndKindInt64Const:
        return false;
    case IR::OpndKindList:
    {
        // We should only have RegOpnd in the ListOpnd therefore, we don't need to encode anything
        Assert(opnd->AsListOpnd()->All([](IR::ListOpndType* opnd) { return DontEncode(opnd); }));
        return true;
    }
    default:
        return true;
    }
}